

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharStringCache.cpp
# Opt level: O2

JavascriptString * __thiscall Js::CharStringCache::GetStringForCharA(CharStringCache *this,char c)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  PropertyString *ptr;
  undefined7 in_register_00000031;
  char cVar4;
  ulong uVar5;
  PropertyRecord *local_38;
  PropertyRecord *propertyRecord;
  char16 wc;
  
  uVar5 = CONCAT71(in_register_00000031,c) & 0xffffffff;
  cVar4 = (char)uVar5;
  if (cVar4 < '\0') {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CharStringCache.cpp"
                                ,0x13,"(JavascriptString::IsASCII7BitChar(c))",
                                "GetStringForCharA must be called with ASCII 7bit chars only");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  ptr = this->charStringCacheA[cVar4].ptr;
  if (ptr == (PropertyString *)0x0) {
    propertyRecord._6_2_ = (undefined2)uVar5;
    ScriptContext::GetOrAddPropertyRecord
              ((ScriptContext *)this[-5].charStringCacheA[0x73].ptr,
               (LPCWSTR)((long)&propertyRecord + 6),1,&local_38);
    ptr = JavascriptLibrary::CreatePropertyString
                    ((JavascriptLibrary *)(this[-6].charStringCacheA + 0x62),local_38);
    Memory::WriteBarrierPtr<Js::PropertyString>::WriteBarrierSet(this->charStringCacheA + cVar4,ptr)
    ;
  }
  return &ptr->super_JavascriptString;
}

Assistant:

JavascriptString* CharStringCache::GetStringForCharA(char c)
    {
        AssertMsg(JavascriptString::IsASCII7BitChar(c), "GetStringForCharA must be called with ASCII 7bit chars only");

        PropertyString * str = charStringCacheA[(int)c];
        if (str == nullptr)
        {
            PropertyRecord const * propertyRecord;
            char16 wc = c;
            JavascriptLibrary * javascriptLibrary = JavascriptLibrary::FromCharStringCache(this);
            javascriptLibrary->GetScriptContext()->GetOrAddPropertyRecord(&wc, 1, &propertyRecord);
            str = javascriptLibrary->CreatePropertyString(propertyRecord);
            charStringCacheA[(int)c] = str;
        }

        return str;
    }